

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

void __thiscall QSpanCollection::updateInsertedRows(QSpanCollection *this,int start,int end)

{
  int *piVar1;
  iterator __begin1;
  QSpanCollection *pQVar2;
  iterator it;
  iterator iVar3;
  int iVar4;
  iterator __end1;
  Index *this_00;
  long in_FS_OFFSET;
  int local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QSpanCollection *)
           (this->spans).
           super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  if (pQVar2 != this) {
    iVar4 = (end - start) + 1;
    for (; pQVar2 != this;
        pQVar2 = (QSpanCollection *)
                 (pQVar2->spans).
                 super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>
                 ._M_impl._M_node.super__List_node_base._M_next) {
      piVar1 = (int *)(pQVar2->spans).
                      super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>
                      ._M_impl._M_node._M_size;
      if (start <= piVar1[2]) {
        if (start <= *piVar1) {
          *piVar1 = *piVar1 + iVar4;
        }
        piVar1[2] = piVar1[2] + iVar4;
      }
    }
    this_00 = &this->index;
    it._M_node = (_Base_ptr)QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::begin(this_00);
    while( true ) {
      iVar3 = QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::end(this_00);
      if ((iterator)it._M_node == iVar3.i._M_node) break;
      if ((int)-it._M_node[1]._M_color < start) {
        it._M_node = (_Base_ptr)std::_Rb_tree_increment(it._M_node);
      }
      else {
        local_34 = it._M_node[1]._M_color - iVar4;
        QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::insert
                  (this_00,&local_34,(QMap<int,_QSpanCollection::Span_*> *)&it._M_node[1]._M_parent)
        ;
        it._M_node = (_Base_ptr)
                     QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::erase(this_00,it._M_node);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSpanCollection::updateInsertedRows(int start, int end)
{
#ifdef DEBUG_SPAN_UPDATE
    qDebug() << start << end << Qt::endl << index;
#endif
    if (spans.empty())
        return;

    int delta = end - start + 1;
#ifdef DEBUG_SPAN_UPDATE
    qDebug("Before");
#endif
    for (Span *span : spans) {
#ifdef DEBUG_SPAN_UPDATE
        qDebug() << span << *span;
#endif
        if (span->m_bottom < start)
            continue;
        if (span->m_top >= start)
            span->m_top += delta;
        span->m_bottom += delta;
    }

#ifdef DEBUG_SPAN_UPDATE
    qDebug("After");
    qDebug() << spans;
#endif

    for (Index::iterator it_y = index.begin(); it_y != index.end(); ) {
        int y = -it_y.key();
        if (y < start) {
            ++it_y;
            continue;
        }

        index.insert(-y - delta, it_y.value());
        it_y = index.erase(it_y);
    }
#ifdef DEBUG_SPAN_UPDATE
    qDebug() << index;
#endif
}